

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  Address AVar4;
  Var *pVVar5;
  pointer pcVar6;
  Expr *pEVar7;
  size_t sVar8;
  Expr *pEVar9;
  VarExpr<(wabt::ExprType)24> *ve;
  const_iterator cVar10;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view prefix;
  string_view prefix_00;
  string_view infix;
  Location *pLVar11;
  pointer child;
  Value *__return_storage_ptr___00;
  int iVar12;
  Type TVar13;
  long *plVar14;
  mapped_type *pmVar15;
  undefined8 *puVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  Expr *pEVar18;
  uint *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Expr *pEVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  Expr *pEVar25;
  char *pcVar26;
  _Alloc_hider _Var27;
  char (*in_R8) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  size_type sVar28;
  Expr *pEVar29;
  pointer pNVar30;
  Precedence PVar31;
  string_view *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  pointer pNVar32;
  Expr *pEVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  Node *c;
  ulong uVar34;
  Var *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool bVar35;
  string_view prefix_01;
  string_view prefix_02;
  string_view y;
  string_view prefix_03;
  string_view infix_00;
  string_view first_indent;
  string_view prefix_04;
  string_view sVar36;
  string decls;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 uVar37;
  undefined1 local_198 [32];
  undefined1 local_178 [16];
  string_view local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  Expr *local_140;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> local_138;
  Node *local_118;
  Value *local_110;
  string local_108;
  char *local_e8;
  undefined8 uStack_e0;
  char *local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  char *local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 uStack_90;
  char *local_88;
  undefined8 uStack_80;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  pointer pbStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar30 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar32 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_140 = (Expr *)parent;
  local_110 = __return_storage_ptr__;
  if (pNVar30 != pNVar32) {
    do {
      DecompileExpr((Value *)local_198,this,pNVar30,n);
      std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
      emplace_back<wabt::Decompiler::Value>(&local_138,(Value *)local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
      pNVar30 = pNVar30 + 1;
    } while (pNVar30 != pNVar32);
  }
  __return_storage_ptr___00 = local_110;
  child = local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start;
  args_1 = &switchD_00147deb::switchdataD_001a4dd0;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                  ,0x18a,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"let ","");
    if ((n->u).field_0.var_count != 0) {
      uVar22 = 0;
      do {
        if (uVar22 != 0) {
          std::__cxx11::string::append(local_198);
        }
        TempVarName_abi_cxx11_((string *)&local_168,this,(n->u).field_0.var_start + uVar22);
        std::__cxx11::string::_M_append(local_198,(ulong)local_168.data_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.data_ != &local_158) {
          operator_delete(local_168.data_);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (n->u).field_0.var_count);
    }
    std::__cxx11::string::append(local_198);
    prefix.size_ = local_198._8_8_;
    prefix.data_ = (char *)local_198._0_8_;
    local_68 = "";
    uStack_60 = 0;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix,(string_view)ZEXT816(0x1a5171),Assign)
    ;
    goto LAB_001481c9;
  case FlushedVar:
    TempVarName_abi_cxx11_((string *)local_198,this,(n->u).field_0.var_start);
LAB_001480cd:
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
LAB_00148109:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
LAB_001481c9:
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    _Var27._M_p = (pointer)local_198._0_8_;
    goto LAB_001481ce;
  case Statements:
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_198);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198);
    if ((n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar34 = 0;
      do {
        pEVar18 = ((intrusive_list_base<wabt::Expr> *)
                  ((long)local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8))[uVar34 * 2].next_;
        cVar1 = *(char *)((pEVar18[-1].loc.filename.size_ - 1) +
                         pEVar18[-1].loc.field_1.field_1.offset);
        if ((cVar1 != ':') && (cVar1 != '}')) {
          std::__cxx11::string::push_back((char)pEVar18 + -0x20);
        }
        __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&(local_138.
                           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v + uVar34 * 4 * 8);
        lVar23 = (long)((intrusive_list_base<wabt::Expr> *)
                       ((long)local_138.
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))[uVar34 * 2].next_ -
                 (long)__args >> 5;
        if (0 < lVar23) {
          uVar24 = lVar23 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr___00,__args);
            __args = __args + 1;
            uVar24 = uVar24 - 1;
          } while (1 < uVar24);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 < (ulong)(((long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    goto LAB_001484f8;
  case EndReturn:
    local_78 = "";
    uStack_70 = 0;
LAB_00147fbb:
    pcVar21 = "return ";
    sVar28 = 7;
LAB_00147fd1:
    prefix_01.size_ = sVar28;
    prefix_01.data_ = pcVar21;
    WrapNAry(local_110,this,&local_138,prefix_01,(string_view)ZEXT816(0x1a5171),None);
    goto LAB_001484f8;
  case Decl:
    if (((n->u).var)->type_ != Name) {
LAB_001495ac:
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                    0x39,"const std::string &wabt::Var::name() const");
    }
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pmVar15->defined = true;
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_001495ac;
    paVar17 = &local_108.field_2;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar13 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_108,TVar13);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x1a5807);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar19) {
      local_198._16_8_ = paVar19->_M_allocated_capacity;
      local_198._24_8_ = plVar14[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar19->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_198._8_8_ = plVar14[1];
    *plVar14 = (long)paVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    _Var27._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
      _Var27._M_p = local_108._M_dataplus._M_p;
    }
    goto LAB_001484ee;
  case DeclInit:
    if (((n->u).var)->type_ != Name) goto LAB_001495ac;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pEVar18 = (Expr *)local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if (pmVar15->defined == true) {
      if (((n->u).var)->type_ != Name) goto LAB_001495ac;
      local_168 = VarName(this,*(string_view *)&((n->u).var)->field_2);
      cat<wabt::string_view,char[4]>
                ((string *)local_198,(wabt *)&local_168,(string_view *)0x1a515a,(char (*) [4])args_1
                );
      local_88 = "";
      uStack_80 = 0;
      uVar22 = 0x1a5171;
      uVar37 = 0;
      PVar31 = None;
      goto LAB_001481c1;
    }
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_001495ac;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar13 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_108,TVar13);
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_198,(wabt *)"var ",(char (*) [5])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a515a,in_R8);
    prefix_00.size_ = local_198._8_8_;
    prefix_00.data_ = (char *)local_198._0_8_;
    local_98 = "";
    uStack_90 = 0;
    WrapChild(__return_storage_ptr___00,this,(Value *)pEVar18,prefix_00,
              (string_view)ZEXT816(0x1a5171),None);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
    }
    _Var27._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_001484f8;
    goto LAB_001484f3;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    if (n->e->type_ != Binary) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_00149790:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x48,pcVar21);
    }
    OpcodeToToken_abi_cxx11_((string *)local_198,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    iVar12 = std::__cxx11::string::compare((char *)local_198);
    PVar31 = Multiply;
    if (((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare(local_198), iVar12 != 0)) &&
       (iVar12 = std::__cxx11::string::compare(local_198), iVar12 != 0)) {
      iVar12 = std::__cxx11::string::compare(local_198);
      PVar31 = Add;
      if ((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare(local_198), iVar12 != 0)) {
        iVar12 = std::__cxx11::string::compare(local_198);
        PVar31 = Bit;
        if ((iVar12 != 0) &&
           ((iVar12 = std::__cxx11::string::compare(local_198), iVar12 != 0 &&
            (iVar12 = std::__cxx11::string::compare(local_198), iVar12 != 0)))) {
          iVar12 = std::__cxx11::string::compare(local_198);
          if (iVar12 != 0) {
            iVar12 = std::__cxx11::string::compare(local_198);
            PVar31 = OtherBin;
            if (iVar12 != 0) goto LAB_00148321;
          }
          PVar31 = Shift;
        }
      }
    }
LAB_00148321:
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)&local_168,(wabt *)0x1a526e,(char (*) [2])local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a526e,
               (char (*) [2])in_R8);
    WrapBinary(__return_storage_ptr___00,this,&local_138,local_168,false,PVar31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
      operator_delete(local_168.data_);
    }
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    goto LAB_0014910b;
  case Block:
    pEVar18 = n->e;
    if (pEVar18->type_ != Block) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    name_00.data_ = (char *)pEVar18[1]._vptr_Expr;
    name_00.size_ = (size_type)pEVar18[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_00);
    cat<char[7],wabt::string_view,char[2]>
              ((string *)local_198,(wabt *)"label ",(char (*) [7])&local_168,(string_view *)":",
               (char (*) [2])&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (string *)local_198);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar17) {
      operator_delete((void *)local_198._0_8_);
    }
    if (((((local_140 != (Expr *)0x0) && (*(NodeType *)&local_140->_vptr_Expr != Statements)) &&
         (EVar2 = *(ExprType *)((long)&local_140->_vptr_Expr + 4), EVar2 != Block)) &&
        (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
          &(local_140->super_intrusive_list_base<wabt::Expr>).prev_)->
         super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
         super__Vector_impl_data._M_start == n)))) {
      IndentValue(this,child,this->indent_amount,(string_view)ZEXT816(0));
      cVar10._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&child->v;
      local_198._0_8_ = paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"{","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&child->v,cVar10,(value_type *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != paVar17) {
        operator_delete((void *)local_198._0_8_);
      }
      local_198._0_8_ = paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != paVar17) {
        operator_delete((void *)local_198._0_8_);
      }
    }
    PVar31 = Atomic;
    *(undefined4 *)&(((Location *)&child->precedence)->filename).data_ = 10;
    pEVar18 = ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&child->v;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar18;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
                  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    *(_func_int ***)&child->v = (_func_int **)0x0;
    ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_ = (Expr *)0x0;
    (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
     &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
    super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    goto LAB_00149092;
  case Br:
    pEVar18 = n->e;
    if (pEVar18->type_ != Br) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    if ((int)pEVar18[1].loc.filename.size_ != 1) goto LAB_001495ac;
    pcVar21 = "goto ";
    if ((n->u).field_0.var_start == 2) {
      pcVar21 = "continue ";
    }
    sVar36 = VarName(this,(string_view)pEVar18[1].loc.field_1);
    y.size_ = (size_type)in_R8;
    y.data_ = (char *)sVar36.size_;
    operator+[abi_cxx11_((string *)local_198,(wabt *)pcVar21,sVar36.data_,y);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
    goto LAB_00148109;
  case BrIf:
    pEVar18 = n->e;
    if (pEVar18->type_ != BrIf) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    local_108._M_dataplus._M_p = "goto";
    if ((n->u).field_0.var_start == 2) {
      local_108._M_dataplus._M_p = "continue";
    }
    if ((int)pEVar18[1].loc.filename.size_ != 1) goto LAB_001495ac;
    local_168 = VarName(this,(string_view)pEVar18[1].loc.field_1);
    cat<char[3],char_const*,char[2],wabt::string_view>
              ((string *)local_198,(wabt *)") ",(char (*) [3])&local_108,(char **)0x1a526e,
               (char (*) [2])&local_168,in_R9);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_198._0_8_;
    pbStack_50 = (pointer)local_198._8_8_;
    postfix_00.size_._0_4_ = (int)local_198._8_8_;
    postfix_00.data_ = (char *)local_198._0_8_;
    postfix_00.size_._4_4_ = SUB84(local_198._8_8_,4);
    prefix_03.size_ = 4;
    prefix_03.data_ = "if (";
    WrapChild(__return_storage_ptr___00,this,child,prefix_03,postfix_00,None);
    goto LAB_001481c9;
  default:
    local_198._0_8_ = local_198 + 0x10;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
    if ((int)EVar2 < 0x1a) {
      if (EVar2 != Call) {
        if (EVar2 != CallIndirect) {
          if (EVar2 == Convert) {
            pEVar18 = n->e;
            if (pEVar18->type_ != Convert) {
              pcVar21 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Convert>, Base = wabt::Expr]"
              ;
              goto LAB_00149790;
            }
            goto LAB_001493ec;
          }
          goto switchD_00148da7_caseD_1b;
        }
        pcVar21 = "call_indirect";
        goto LAB_00149523;
      }
      if (n->e->type_ != Call) {
        pcVar21 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Call>, Base = wabt::Expr]"
        ;
        goto LAB_00149790;
      }
      if ((int)n->e[1].loc.filename.size_ != 1) goto LAB_001495ac;
      std::__cxx11::string::_M_assign((string *)local_198);
    }
    else {
      switch(EVar2) {
      case MemoryCopy:
        pcVar21 = "memory_copy";
        break;
      case MemoryFill:
        pcVar21 = "memory_fill";
        break;
      case MemoryGrow:
        pcVar21 = "memory_grow";
        break;
      case MemorySize:
        pcVar21 = "memory_size";
        break;
      case RefIsNull:
        pcVar21 = "is_null";
        break;
      case ReturnCall:
        pEVar18 = n->e;
        if (pEVar18->type_ != ReturnCall) {
          pcVar21 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::ReturnCall>, Base = wabt::Expr]"
          ;
          goto LAB_00149790;
        }
        if ((int)pEVar18[1].loc.filename.size_ != 1) goto LAB_001495ac;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_168,"return_call ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar18[1].loc.field_1.field_0);
        std::__cxx11::string::operator=((string *)local_198,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.data_ != &local_158) {
          operator_delete(local_168.data_);
        }
        PVar31 = None;
        goto LAB_0014952d;
      case ReturnCallIndirect:
        pcVar21 = "return_call call_indirect";
        break;
      case Select:
        pcVar21 = "select_if";
        break;
      default:
        if (EVar2 == Ternary) {
          pEVar18 = n->e;
          if (pEVar18->type_ != Ternary) {
            pcVar21 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Ternary>, Base = wabt::Expr]"
            ;
            goto LAB_00149790;
          }
LAB_001493ec:
          OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&pEVar18->field_0x3c);
          std::__cxx11::string::operator=((string *)local_198,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.data_ != &local_158) {
            operator_delete(local_168.data_);
          }
          goto LAB_00149528;
        }
      case DataDrop:
      case MemoryInit:
      case Nop:
      case RefFunc:
      case RefNull:
      case Rethrow:
      case Return:
switchD_00148da7_caseD_1b:
        pcVar21 = GetExprTypeName(EVar2);
      }
LAB_00149523:
      std::__cxx11::string::operator=((string *)local_198,pcVar21);
    }
LAB_00149528:
    PVar31 = Atomic;
LAB_0014952d:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   "(");
    local_e8 = ")";
    uStack_e0 = 1;
    postfix_01.size_._0_4_ = 1;
    postfix_01.data_ = ")";
    postfix_01.size_._4_4_ = 0;
    WrapNAry(__return_storage_ptr___00,this,&local_138,local_168,postfix_01,PVar31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) {
LAB_00149594:
      operator_delete(local_168.data_);
    }
LAB_00149599:
    _Var27._M_p = (pointer)local_198._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) break;
    goto LAB_001484f3;
  case BrTable:
    pEVar18 = n->e;
    if (pEVar18->type_ != BrTable) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BrTableExpr, Base = wabt::Expr]";
      goto LAB_00149790;
    }
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"br_table[","");
    pEVar20 = (Expr *)(((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                       &pEVar18[1]._vptr_Expr)->_M_impl).super__Vector_impl_data._M_start;
    pEVar29 = pEVar18[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_140 = pEVar18;
    if (pEVar20 != pEVar29) {
      do {
        if (*(int *)&(pEVar20->loc).filename.size_ != 1) goto LAB_001495ac;
        sVar36 = VarName(this,(string_view)(pEVar20->loc).field_1);
        std::__cxx11::string::append(local_198,(ulong)sVar36.data_);
        std::__cxx11::string::append(local_198);
        pEVar20 = (Expr *)&pEVar20[1].super_intrusive_list_base<wabt::Expr>;
      } while (pEVar20 != pEVar29);
    }
    std::__cxx11::string::append(local_198);
    if (local_140[1].type_ != AtomicRmw) goto LAB_001495ac;
    name.data_ = (char *)local_140[2]._vptr_Expr;
    name.size_ = (size_type)local_140[2].super_intrusive_list_base<wabt::Expr>.next_;
    sVar36 = VarName(this,name);
    std::__cxx11::string::append(local_198,(ulong)sVar36.data_);
    std::__cxx11::string::append(local_198);
    local_d8 = ")";
    uStack_d0 = 1;
    uVar22 = 0x1a72df;
    uVar37 = 1;
    PVar31 = Atomic;
    pEVar18 = (Expr *)local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_001481c1:
    postfix.size_._0_4_ = uVar37;
    postfix.data_ = (char *)(ulong)uVar22;
    postfix.size_._4_4_ = 0;
    prefix_02.size_ = local_198._8_8_;
    prefix_02.data_ = (char *)local_198._0_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pEVar18,prefix_02,postfix,PVar31);
    goto LAB_001481c9;
  case Compare:
    if (n->e->type_ != Compare) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Compare>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)local_198,(wabt *)0x1a526e,(char (*) [2])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a526e,
               (char (*) [2])in_R8);
    infix.size_ = local_198._8_8_;
    infix.data_ = (char *)local_198._0_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix,false,Equal);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_00149106;
LAB_00149101:
    operator_delete((void *)local_198._0_8_);
    goto LAB_00149106;
  case Const:
    pEVar18 = n->e;
    if (pEVar18->type_ != Const) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
      goto LAB_00149790;
    }
    switch((int)pEVar18[1].loc.filename.size_) {
    case -5:
      pcVar26 = "V128";
      pcVar21 = "";
      goto LAB_00148dcf;
    case -4:
      to_string_abi_cxx11_((string *)local_198,this,(double)pEVar18[1].loc.field_1.field_1.offset);
      goto LAB_001480cd;
    case -3:
      to_string_abi_cxx11_((string *)&local_168,this,(double)*(float *)&pEVar18[1].loc.field_1);
      break;
    case -2:
      std::__cxx11::to_string((string *)&local_168,pEVar18[1].loc.field_1.field_1.offset);
      break;
    case -1:
      std::__cxx11::to_string((string *)local_198,pEVar18[1].loc.field_1.field_0.line);
      local_168 = (string_view)ZEXT816(0);
      local_158._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
                 (string *)local_198,local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr___00->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_168);
      __return_storage_ptr___00->precedence = Atomic;
      goto LAB_00148109;
    default:
      abort();
    }
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar17) {
      local_198._16_8_ = paVar17->_M_allocated_capacity;
      local_198._24_8_ = puVar16[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar17->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar16;
    }
    local_198._8_8_ = puVar16[1];
    *puVar16 = paVar17;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108);
    __return_storage_ptr___00->precedence = Atomic;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_00149101;
    goto LAB_00149106;
  case Drop:
    goto switchD_00148202_caseD_11;
  case GlobalGet:
    if ((((VarExpr<(wabt::ExprType)18> *)n->e)->super_ExprMixin<(wabt::ExprType)18>).super_Expr.
        type_ != GlobalGet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalGet>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    Get<(wabt::ExprType)18>(local_110,this,(VarExpr<(wabt::ExprType)18> *)n->e);
    break;
  case GlobalSet:
    if ((((VarExpr<(wabt::ExprType)19> *)n->e)->super_ExprMixin<(wabt::ExprType)19>).super_Expr.
        type_ != GlobalSet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalSet>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    Set<(wabt::ExprType)19>
              (local_110,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)19> *)n->e);
    break;
  case If:
    if (n->e->type_ != If) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
      goto LAB_00149790;
    }
    pEVar18 = *(Expr **)&(local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v;
    pEVar20 = ((intrusive_list_base<wabt::Expr> *)
              ((long)local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8))->next_;
    bVar35 = true;
    if ((ulong)((long)pEVar20 - (long)pEVar18) < 0x21) {
      bVar35 = 0x20 < (((Location *)
                       &(local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start)->precedence)->field_1).field_1.
                      offset - (long)(((Location *)
                                      &(local_138.
                                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->precedence)->
                                     filename).size_;
    }
    pEVar25 = (Expr *)0x0;
    for (pEVar29 = pEVar18; pEVar29 != pEVar20; pEVar29 = (Expr *)&(pEVar29->loc).filename.size_) {
      pEVar7 = (pEVar29->super_intrusive_list_base<wabt::Expr>).next_;
      if (pEVar25 <= pEVar7) {
        pEVar25 = pEVar7;
      }
    }
    sVar8 = n->e[4].loc.field_1.field_1.offset;
    pEVar20 = (Expr *)0x0;
    pNVar30 = (pointer)(((Location *)
                        &(local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->precedence)->filename).size_;
    for (pNVar32 = pNVar30;
        pNVar32 !=
        (pointer)(((Location *)
                  &(local_138.
                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start)->precedence)->field_1).field_1.offset
        ; pNVar32 = (pointer)&(pNVar32->children).
                              super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
      if (pEVar20 <= pNVar32->e) {
        pEVar20 = pNVar32->e;
      }
    }
    uVar34 = (long)&pEVar20->_vptr_Expr + (long)pEVar25;
    pEVar20 = (Expr *)((long)local_138.
                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x40);
    if (sVar8 != 0) {
      pEVar25 = (((Expr *)((long)local_138.
                                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                super_intrusive_list_base<wabt::Expr>).next_;
      pEVar33 = (Expr *)0x0;
      pEVar29 = (Expr *)(((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                         &((Expr *)((long)local_138.
                                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                          _vptr_Expr)->_M_impl).super__Vector_impl_data._M_start;
      for (pEVar7 = pEVar29; pEVar7 != pEVar25; pEVar7 = (Expr *)&(pEVar7->loc).filename.size_) {
        pEVar9 = (pEVar7->super_intrusive_list_base<wabt::Expr>).next_;
        if (pEVar33 <= pEVar9) {
          pEVar33 = pEVar9;
        }
      }
      if (!bVar35) {
        uVar34 = (long)&pEVar33->_vptr_Expr + uVar34;
        bVar35 = 0x20 < (ulong)((long)pEVar25 - (long)pEVar29);
        goto LAB_001486ae;
      }
LAB_00148f1f:
      pLVar11 = (Location *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->precedence;
      first_indent.size_ = 4;
      first_indent.data_ = "if (";
      local_140 = pEVar20;
      IndentValue(this,local_138.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start,4,first_indent);
      std::__cxx11::string::append
                ((char *)&((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_[-1].loc.
                          filename.size_);
      IndentValue(this,(Value *)&(pLVar11->filename).size_,this->indent_amount,
                  (string_view)ZEXT816(0));
      pNVar30 = (pointer)(((Location *)&child->precedence)->filename).size_;
      lVar23 = (long)((((Location *)&child->precedence)->field_1).field_1.offset - (long)pNVar30) >>
               5;
      if (0 < lVar23) {
        uVar34 = lVar23 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar30);
          pNVar30 = (pointer)&(pNVar30->children).
                              super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
          uVar34 = uVar34 - 1;
        } while (1 < uVar34);
      }
      if (sVar8 != 0) {
        local_198._0_8_ = (pointer)(local_198 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"} else {","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
        if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_);
        }
        IndentValue(this,(Value *)local_140,this->indent_amount,(string_view)ZEXT816(0));
        pNVar30 = (((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((Expr *)((long)child + 0x40))->_vptr_Expr)->_M_impl).super__Vector_impl_data.
                  _M_start;
        lVar23 = (long)(((Expr *)((long)child + 0x40))->super_intrusive_list_base<wabt::Expr>).next_
                 - (long)pNVar30 >> 5;
        if (0 < lVar23) {
          uVar34 = lVar23 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar30)
            ;
            pNVar30 = (pointer)((long)&(pNVar30->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl + 0x10);
            uVar34 = uVar34 - 1;
          } while (1 < uVar34);
        }
      }
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_);
      }
      PVar31 = If;
      goto LAB_00149070;
    }
LAB_001486ae:
    if ((bVar35) || (this->target_exp_width < uVar34)) goto LAB_00148f1f;
    cat<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
              ((string *)local_198,(wabt *)"if (",(char (*) [5])pEVar18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") { ",
               (char (*) [5])pNVar30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
               (char (*) [3])CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (sVar8 != 0) {
      cat<char[9],std::__cxx11::string,char[3]>
                ((string *)&local_168,(wabt *)" else { ",(char (*) [9])pEVar20->_vptr_Expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                 (char (*) [3])pNVar30);
      std::__cxx11::string::_M_append(local_198,(ulong)local_168.data_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.data_ != &local_158) {
        operator_delete(local_168.data_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      local_158._8_8_ = local_198._24_8_;
      local_198._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = local_198._16_8_;
    local_168.size_ = local_198._8_8_;
    local_168.data_ = (char *)local_198._0_8_;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_198 + 0x10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108);
    __return_storage_ptr___00->precedence = If;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.data_ != &local_158) goto LAB_00149594;
    goto LAB_00149599;
  case Load:
    pEVar18 = n->e;
    if (pEVar18->type_ != Load) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Load>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    local_140 = (Expr *)local_138.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_118 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar22 = *(uint *)((long)&pEVar18[1]._vptr_Expr + 4);
    OVar3.enum_ = *(Enum *)&pEVar18->field_0x3c;
    AVar4 = *(Address *)&pEVar18[1]._vptr_Expr;
    Opcode::GetInfo((Opcode *)&pEVar18->field_0x3c);
    LoadStore(this,(Value *)local_140,local_118,(ulong)uVar22,OVar3,AVar4,(Type)local_198._16_4_);
    goto switchD_00148202_caseD_11;
  case LocalGet:
    if ((((VarExpr<(wabt::ExprType)22> *)n->e)->super_ExprMixin<(wabt::ExprType)22>).super_Expr.
        type_ != LocalGet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    Get<(wabt::ExprType)22>(local_110,this,(VarExpr<(wabt::ExprType)22> *)n->e);
    break;
  case LocalSet:
    if ((((VarExpr<(wabt::ExprType)23> *)n->e)->super_ExprMixin<(wabt::ExprType)23>).super_Expr.
        type_ != LocalSet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalSet>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    Set<(wabt::ExprType)23>
              (local_110,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)23> *)n->e);
    break;
  case LocalTee:
    ve = (VarExpr<(wabt::ExprType)24> *)n->e;
    if ((ve->super_ExprMixin<(wabt::ExprType)24>).super_Expr.type_ != LocalTee) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    if (local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)24>(local_110,this,ve);
    }
    else {
      Set<(wabt::ExprType)24>
                (local_110,this,
                 local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve);
    }
    break;
  case Loop:
    pEVar18 = n->e;
    if (pEVar18->type_ != Loop) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    IndentValue(this,local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start,this->indent_amount,
                (string_view)ZEXT816(0));
    cVar10._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&child->v;
    name_01.data_ = (char *)pEVar18[1]._vptr_Expr;
    name_01.size_ = (size_type)pEVar18[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_01);
    cat<char[6],wabt::string_view,char[3]>
              ((string *)local_198,(wabt *)"loop ",(char (*) [6])&local_168,(string_view *)0x1a41e4,
               (char (*) [3])&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,cVar10,(string *)local_198);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar17) {
      operator_delete((void *)local_198._0_8_);
    }
    local_198._0_8_ = paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"}","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar17) {
      operator_delete((void *)local_198._0_8_);
    }
    PVar31 = Atomic;
LAB_00149070:
    *(Precedence *)&(((Location *)&child->precedence)->filename).data_ = PVar31;
    pEVar18 = ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&child->v;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar18;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
                  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    *(_func_int ***)&child->v = (_func_int **)0x0;
    ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_ = (Expr *)0x0;
    (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
     &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
    super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
LAB_00149092:
    __return_storage_ptr___00->precedence = PVar31;
    break;
  case Nop:
    pcVar26 = "nop";
    pcVar21 = "";
    goto LAB_00148e2e;
  case RefNull:
    pcVar26 = "null";
    pcVar21 = "";
LAB_00148dcf:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar26,pcVar21);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
    goto LAB_00148e74;
  case Rethrow:
    local_c8 = "";
    uStack_c0 = 0;
    pcVar21 = "rethrow ";
    sVar28 = 8;
    goto LAB_00147fd1;
  case Return:
    local_b8 = "";
    uStack_b0 = 0;
    goto LAB_00147fbb;
  case Store:
    pEVar18 = n->e;
    if (pEVar18->type_ != Store) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Store>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    local_140 = (Expr *)(n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    local_118 = (Node *)(ulong)*(uint *)((long)&pEVar18[1]._vptr_Expr + 4);
    OVar3.enum_ = *(Enum *)&pEVar18->field_0x3c;
    AVar4 = *(Address *)&pEVar18[1]._vptr_Expr;
    Opcode::GetInfo((Opcode *)&pEVar18->field_0x3c);
    LoadStore(this,child,(Node *)local_140,(uint64_t)local_118,OVar3,AVar4,(Type)local_198._24_4_);
    infix_00.size_ = 3;
    infix_00.data_ = " = ";
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_00,true,Assign);
    break;
  case Unary:
    if (n->e->type_ != Unary) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Unary>, Base = wabt::Expr]"
      ;
      goto LAB_00149790;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar17) {
      local_198._16_8_ = paVar17->_M_allocated_capacity;
      local_198._24_8_ = puVar16[3];
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ = paVar17->_M_allocated_capacity;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar16;
    }
    local_198._8_8_ = puVar16[1];
    *puVar16 = paVar17;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_a8 = ")";
    uStack_a0 = 1;
    sVar36.size_._0_4_ = 1;
    sVar36.data_ = ")";
    sVar36.size_._4_4_ = 0;
    prefix_04.size_ = local_198._8_8_;
    prefix_04.data_ = (char *)local_198._0_8_;
    WrapChild(__return_storage_ptr___00,this,child,prefix_04,sVar36,Atomic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) goto LAB_00149101;
LAB_00149106:
    paVar17 = &local_158;
LAB_0014910b:
    _Var27._M_p = *(pointer *)(paVar17->_M_local_buf + -0x10);
LAB_001481ce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var27._M_p != paVar17) {
LAB_001484f3:
      operator_delete(_Var27._M_p);
    }
    break;
  case Last:
    pcVar26 = "unreachable";
    pcVar21 = "";
LAB_00148e2e:
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar26,pcVar21);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_198,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
LAB_00148e74:
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    _Var27._M_p = (pointer)local_198._0_8_;
LAB_001484ee:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var27._M_p == paVar17) break;
    goto LAB_001484f3;
  }
LAB_001484f8:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            (&local_138);
  return __return_storage_ptr___00;
switchD_00148202_caseD_11:
  pEVar18 = ((intrusive_list_base<wabt::Expr> *)
            ((long)local_138.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start + 8))->next_;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &(local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start)->v;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar18;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                 &((intrusive_list_base<wabt::Expr> *)
                  ((long)local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8))->prev_)->
                super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
  *(_func_int ***)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v = (_func_int **)0x0;
  ((intrusive_list_base<wabt::Expr> *)
  ((long)local_138.
         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
         _M_impl.super__Vector_impl_data._M_start + 8))->next_ = (Expr *)0x0;
  (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
   &((intrusive_list_base<wabt::Expr> *)
    ((long)local_138.
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
           _M_impl.super__Vector_impl_data._M_start + 8))->prev_)->
  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  PVar31 = *(Precedence *)
            &(((Location *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->precedence)->filename).data_;
  goto LAB_00149092;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) decls += ", ";
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value { { TempVarName(n.u.var_start) }, Precedence::Atomic };
      }
      case NodeType::Statements: {
        Value stats { {}, Precedence::None };
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') s += ';';
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{
            {"var " + LocalDecl(std::string(n.u.var->name()),
                                cur_func->GetLocalType(*n.u.var))},
            Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(
              args[0],
              cat("var ",
                  LocalDecl(std::string(n.u.var->name()),
                            cur_func->GetLocalType(*n.u.var)),
                  " = "),
              "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, cat(" ", opcs, " "), false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
         return WrapBinary(args, cat(" ", OpcodeToToken(ce.opcode), " "), false,
                           Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        //BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, " = ", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value *elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(), std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") { ", thenp.v[0], " }");
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
              cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements
                   && parent->etype != ExprType::Block
                   && parent->etype != ExprType::Loop
                   && (parent->etype != ExprType::If ||
                       &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (", cat(") ", jmp, " ",
                                              VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto &v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }